

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

pair<slang::syntax::PragmaExpressionSyntax_*,_bool> __thiscall
slang::parsing::Preprocessor::parsePragmaValue(Preprocessor *this)

{
  Token token_00;
  Token lastConsumed;
  Token matchingDelim;
  bool bVar1;
  undefined1 uVar2;
  type_conflict2 *ptVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  Info *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  long in_RDI;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar4;
  Token TVar5;
  Token TVar6;
  Token TVar7;
  Token TVar8;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar9;
  Token TVar10;
  Token TVar11;
  Token closeParen;
  Token nextUp;
  type_conflict2 *succeeded;
  type *expr_1;
  Token comma;
  Token lastToken;
  bool ok;
  bool wantComma;
  Token openParen;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> values;
  Token expected;
  Token result_1;
  IntResult result;
  PragmaExpressionSyntax *expr;
  Token token;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pair;
  Preprocessor *in_stack_fffffffffffffc18;
  Preprocessor *in_stack_fffffffffffffc20;
  SourceLocation in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  DiagCode in_stack_fffffffffffffc34;
  SyntaxNode *in_stack_fffffffffffffc50;
  Token *in_stack_fffffffffffffc58;
  Token *in_stack_fffffffffffffc60;
  Token *in_stack_fffffffffffffc68;
  BumpAllocator *in_stack_fffffffffffffc70;
  Preprocessor *in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  Info *in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  Info *in_stack_fffffffffffffca8;
  undefined8 in_stack_fffffffffffffcb0;
  Preprocessor *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  ParenPragmaExpressionSyntax *local_2d0 [2];
  TokenKind in_stack_fffffffffffffd46;
  Info *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  Info *in_stack_fffffffffffffd90;
  Token TVar12;
  undefined8 in_stack_fffffffffffffd98;
  TokenKind local_258;
  Preprocessor *in_stack_fffffffffffffe18;
  NumberParser *in_stack_fffffffffffffe20;
  bool local_186;
  byte local_185;
  Token local_178;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_168;
  TokenKind in_stack_fffffffffffffee6;
  BumpAllocator *in_stack_fffffffffffffee8;
  SourceLocation in_stack_fffffffffffffef0;
  bool local_e9;
  SimplePragmaExpressionSyntax *local_e8;
  SourceLocation local_e0;
  Token local_d8;
  SourceLocation local_c8;
  undefined4 local_be;
  bool local_b9;
  Token local_b8;
  SimplePragmaExpressionSyntax *local_a8;
  bool local_99;
  SimplePragmaExpressionSyntax *local_98;
  Token local_90;
  bool local_79 [49];
  byte local_48;
  NumberPragmaExpressionSyntax *local_40;
  Token local_38;
  PragmaExpressionSyntax *local_28;
  undefined1 local_20;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> local_10;
  
  pVar4 = checkNextPragmaToken(in_stack_fffffffffffffc80);
  local_28 = pVar4.first;
  local_20 = pVar4.second;
  local_10.second = (bool)local_20;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_10.first = local_28;
    local_38 = peek((Preprocessor *)in_stack_fffffffffffffc28);
    if ((local_38.kind == IntegerBase) || (local_38.kind == IntegerLiteral)) {
      NumberParser::parseInteger<slang::parsing::Preprocessor,true>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      if ((local_48 & 1) == 0) {
        local_40 = BumpAllocator::
                   emplace<slang::syntax::NumberPragmaExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
                             (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                              in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      }
      else {
        local_40 = (NumberPragmaExpressionSyntax *)
                   BumpAllocator::
                   emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                             ((BumpAllocator *)
                              CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                              (Token *)in_stack_fffffffffffffc28);
      }
      local_79[0] = true;
      std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::
      pair<slang::syntax::PragmaExpressionSyntax_*&,_bool,_true>
                (&local_10,(PragmaExpressionSyntax **)&local_40,local_79);
      pVar4._8_8_ = extraout_RDX;
      pVar4.first = local_10.first;
    }
    else if (local_38.kind == RealLiteral) {
      local_90 = NumberParser::parseReal<slang::parsing::Preprocessor>
                           ((NumberParser *)
                            CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
                            in_stack_fffffffffffffcb8);
      local_98 = BumpAllocator::
                 emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                           ((BumpAllocator *)
                            CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                            (Token *)in_stack_fffffffffffffc28);
      local_99 = true;
      std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::
      pair<slang::syntax::SimplePragmaExpressionSyntax_*,_bool,_true>(&local_10,&local_98,&local_99)
      ;
      pVar4._8_8_ = extraout_RDX_00;
      pVar4.first = local_10.first;
    }
    else if (((local_38.kind == Identifier) || (local_38.kind == StringLiteral)) ||
            (bVar1 = LexerFacts::isKeyword(local_38.kind), bVar1)) {
      local_b8 = consume((Preprocessor *)
                         CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      local_a8 = BumpAllocator::
                 emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token>
                           ((BumpAllocator *)
                            CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                            (Token *)in_stack_fffffffffffffc28);
      local_b9 = true;
      std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::
      pair<slang::syntax::SimplePragmaExpressionSyntax_*,_bool,_true>(&local_10,&local_a8,&local_b9)
      ;
      pVar4._8_8_ = extraout_RDX_01;
      pVar4.first = local_10.first;
    }
    else if (local_38.kind == OpenParenthesis) {
      SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
                ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x38dade);
      local_178 = consume((Preprocessor *)
                          CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      TVar6.info = in_stack_fffffffffffffca8;
      TVar6.kind = (short)in_stack_fffffffffffffcb0;
      TVar6._2_1_ = (char)((ulong)in_stack_fffffffffffffcb0 >> 0x10);
      TVar6.numFlags.raw = (char)((ulong)in_stack_fffffffffffffcb0 >> 0x18);
      TVar6.rawLen = (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20);
      local_185 = 0;
      local_186 = false;
      TVar5 = local_178;
      while( true ) {
        bVar1 = peekSameLine(in_stack_fffffffffffffc18);
        if (!bVar1) break;
        local_38 = peek((Preprocessor *)in_stack_fffffffffffffc28);
        if ((local_185 & 1) == 0) {
          pVar4 = parsePragmaExpression
                            ((Preprocessor *)
                             CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
          in_stack_fffffffffffffcc7 = pVar4.second;
          std::get<0ul,slang::syntax::PragmaExpressionSyntax*,bool>
                    ((pair<slang::syntax::PragmaExpressionSyntax_*,_bool> *)0x38dd44);
          ptVar3 = std::get<1ul,slang::syntax::PragmaExpressionSyntax*,bool>
                             ((pair<slang::syntax::PragmaExpressionSyntax_*,_bool> *)0x38dd59);
          slang::syntax::TokenOrSyntax::TokenOrSyntax
                    ((TokenOrSyntax *)in_stack_fffffffffffffc20,
                     (SyntaxNode *)in_stack_fffffffffffffc18);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffc20,
                     (TokenOrSyntax *)in_stack_fffffffffffffc18);
          local_185 = 1;
          if ((*ptVar3 & 1U) == 0) break;
          TVar6 = slang::syntax::SyntaxNode::getLastToken(in_stack_fffffffffffffc50);
          TVar5 = TVar6;
        }
        else {
          if (local_38.kind == CloseParenthesis) {
            local_186 = true;
            break;
          }
          TVar5 = expect(TVar6._0_8_,TVar6.info._6_2_);
          token_00.info._0_4_ = in_stack_fffffffffffffc30;
          token_00._0_8_ = in_stack_fffffffffffffc28;
          token_00.info._4_4_ = in_stack_fffffffffffffc34;
          slang::syntax::TokenOrSyntax::TokenOrSyntax
                    ((TokenOrSyntax *)in_stack_fffffffffffffc20,token_00);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffc20,
                     (TokenOrSyntax *)in_stack_fffffffffffffc18);
          local_185 = 0;
        }
      }
      Token::Token((Token *)in_stack_fffffffffffffc20);
      uVar2 = peekSameLine(in_stack_fffffffffffffc18);
      TVar11.info = in_stack_fffffffffffffd80;
      TVar11.kind = (short)in_stack_fffffffffffffd98;
      TVar11._2_1_ = (char)((ulong)in_stack_fffffffffffffd98 >> 0x10);
      TVar11.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd98 >> 0x18);
      TVar11.rawLen = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
      TVar12.info = in_stack_fffffffffffffd90;
      TVar12.kind = (short)in_stack_fffffffffffffd88;
      TVar12._2_1_ = (char)((ulong)in_stack_fffffffffffffd88 >> 0x10);
      TVar12.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd88 >> 0x18);
      TVar12.rawLen = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
      TVar10.info = in_stack_fffffffffffffc90;
      TVar10.kind = (short)in_stack_fffffffffffffc98;
      TVar10._2_1_ = (char)((ulong)in_stack_fffffffffffffc98 >> 0x10);
      TVar10.numFlags.raw = (char)((ulong)in_stack_fffffffffffffc98 >> 0x18);
      TVar10.rawLen = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
      TVar7.info = (Info *)in_stack_fffffffffffffc80;
      TVar7.kind = (short)in_stack_fffffffffffffc88;
      TVar7._2_1_ = (char)((ulong)in_stack_fffffffffffffc88 >> 0x10);
      TVar7.numFlags.raw = (char)((ulong)in_stack_fffffffffffffc88 >> 0x18);
      TVar7.rawLen = (int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
      TVar6 = TVar5;
      if ((bool)uVar2) {
        TVar6 = peek((Preprocessor *)in_stack_fffffffffffffc28);
        TVar11.info = in_stack_fffffffffffffd80;
        TVar11.kind = (short)in_stack_fffffffffffffd98;
        TVar11._2_1_ = (char)((ulong)in_stack_fffffffffffffd98 >> 0x10);
        TVar11.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd98 >> 0x18);
        TVar11.rawLen = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
        TVar7.info = (Info *)in_stack_fffffffffffffc80;
        TVar7.kind = (short)in_stack_fffffffffffffc88;
        TVar7._2_1_ = (char)((ulong)in_stack_fffffffffffffc88 >> 0x10);
        TVar7.numFlags.raw = (char)((ulong)in_stack_fffffffffffffc88 >> 0x18);
        TVar7.rawLen = (int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
        local_258 = TVar6.kind;
        TVar10 = TVar6;
        TVar12 = TVar6;
        if (local_258 == CloseParenthesis) {
          TVar7 = consume((Preprocessor *)
                          CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
          TVar11 = TVar7;
        }
      }
      bVar1 = Token::operator_cast_to_bool((Token *)0x38df1b);
      TVar8.info = extraout_RDX_03;
      TVar8._0_8_ = in_stack_fffffffffffffc60;
      if (!bVar1) {
        Token::Token((Token *)in_stack_fffffffffffffc20);
        lastConsumed.info = TVar12._0_8_;
        lastConsumed._0_8_ = TVar11.info;
        matchingDelim.info = TVar11._0_8_;
        matchingDelim._0_8_ = TVar12.info;
        TVar8 = Token::createExpected
                          ((BumpAllocator *)TVar5.info,TVar5._0_8_,TVar6,in_stack_fffffffffffffd46,
                           lastConsumed,matchingDelim);
      }
      SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                (&local_168,*(EVP_PKEY_CTX **)(in_RDI + 8),(EVP_PKEY_CTX *)TVar8.info);
      local_2d0[0] = BumpAllocator::
                     emplace<slang::syntax::ParenPragmaExpressionSyntax,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
                               ((BumpAllocator *)CONCAT17(uVar2,in_stack_fffffffffffffca0),
                                TVar10._0_8_,
                                (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)
                                TVar10.info,TVar7._0_8_);
      std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::
      pair<slang::syntax::ParenPragmaExpressionSyntax_*,_bool_&,_true>
                (&local_10,local_2d0,&local_186);
      SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
                ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x38e0a3);
      pVar4._8_8_ = extraout_RDX_04;
      pVar4.first = local_10.first;
    }
    else {
      local_be = 0x80004;
      local_c8 = Token::location(&local_38);
      addDiag(in_stack_fffffffffffffc20,in_stack_fffffffffffffc34,in_stack_fffffffffffffc28);
      local_e0 = Token::location(&local_38);
      local_d8 = Token::createMissing
                           (in_stack_fffffffffffffee8,in_stack_fffffffffffffee6,
                            in_stack_fffffffffffffef0);
      local_e8 = BumpAllocator::
                 emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                           ((BumpAllocator *)
                            CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                            (Token *)in_stack_fffffffffffffc28);
      local_e9 = false;
      std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::
      pair<slang::syntax::SimplePragmaExpressionSyntax_*,_bool,_true>(&local_10,&local_e8,&local_e9)
      ;
      pVar4._8_8_ = extraout_RDX_02;
      pVar4.first = local_10.first;
    }
  }
  local_10.first = pVar4.first;
  pVar9._9_7_ = pVar4._9_7_;
  pVar9.second = local_10.second;
  pVar9.first = local_10.first;
  return pVar9;
}

Assistant:

std::pair<PragmaExpressionSyntax*, bool> Preprocessor::parsePragmaValue() {
    if (auto pair = checkNextPragmaToken(); !pair.second)
        return pair;

    Token token = peek();
    if (token.kind == TokenKind::IntegerBase || token.kind == TokenKind::IntegerLiteral) {
        PragmaExpressionSyntax* expr;
        auto result = numberParser.parseInteger<Preprocessor, true>(*this);
        if (result.isSimple) {
            expr = alloc.emplace<SimplePragmaExpressionSyntax>(result.value);
        }
        else {
            expr = alloc.emplace<NumberPragmaExpressionSyntax>(result.size, result.base,
                                                               result.value);
        }

        return {expr, true};
    }

    if (token.kind == TokenKind::RealLiteral) {
        auto result = numberParser.parseReal(*this);
        return {alloc.emplace<SimplePragmaExpressionSyntax>(result), true};
    }

    if (token.kind == TokenKind::Identifier || token.kind == TokenKind::StringLiteral ||
        LexerFacts::isKeyword(token.kind)) {
        return {alloc.emplace<SimplePragmaExpressionSyntax>(consume()), true};
    }

    if (token.kind != TokenKind::OpenParenthesis) {
        addDiag(diag::ExpectedPragmaExpression, token.location());

        auto expected = Token::createMissing(alloc, TokenKind::Identifier, token.location());
        return {alloc.emplace<SimplePragmaExpressionSyntax>(expected), false};
    }

    SmallVector<TokenOrSyntax, 4> values;
    Token openParen = consume();
    bool wantComma = false;
    bool ok = false;

    // This keeps track of the last real token we've consumed before
    // breaking from the loop; if there's an error it's possible we've
    // gone on and parsed more directives into the resulting token,
    // so this is necessary to correctly place the diagnostic.
    Token lastToken = openParen;

    while (peekSameLine()) {
        token = peek();
        if (wantComma) {
            if (token.kind == TokenKind::CloseParenthesis) {
                ok = true;
                break;
            }

            Token comma = expect(TokenKind::Comma);
            values.push_back(comma);
            wantComma = false;
            lastToken = comma;
        }
        else {
            auto [expr, succeeded] = parsePragmaExpression();
            values.push_back(expr);
            wantComma = true;

            if (!succeeded)
                break;

            lastToken = expr->getLastToken();
        }
    }

    Token nextUp = lastToken;
    Token closeParen;
    if (peekSameLine()) {
        nextUp = peek();
        if (nextUp.kind == TokenKind::CloseParenthesis)
            closeParen = consume();
    }

    if (!closeParen) {
        closeParen = Token::createExpected(alloc, diagnostics, nextUp, TokenKind::CloseParenthesis,
                                           lastToken, Token());
    }

    return {alloc.emplace<ParenPragmaExpressionSyntax>(openParen, values.copy(alloc), closeParen),
            ok};
}